

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<wchar_t[22],std::__cxx11::wstring>
          (char *expected_expression,char *actual_expression,wchar_t (*expected) [22],
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *actual)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDI;
  undefined8 in_R8;
  AssertionResult AVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff68;
  wchar_t *in_stack_ffffffffffffff70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value;
  string local_68 [32];
  string local_48 [39];
  undefined1 ignoring_case;
  string *expected_value;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *expected_expression_00
  ;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  ignoring_case = (undefined1)((ulong)in_R8 >> 0x38);
  value = in_RDI;
  expected_expression_00 = in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    expected_value = in_RDX;
    FormatForComparisonFailureMessage<wchar_t[22],std::__cxx11::wstring>
              ((wchar_t (*) [22])value,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)in_RDX)
    ;
    FormatForComparisonFailureMessage<std::__cxx11::wstring,wchar_t[22]>
              (value,(wchar_t (*) [22])in_RDX);
    EqFailure((char *)expected_expression_00,in_RSI,expected_value,in_RCX,(bool)ignoring_case);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}